

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::computeMinMaxValues
          (SPxMainSM<double> *this,SPxLPBase<double> *lp,double side,double val,double minRes,
          double maxRes,double *minVal,double *maxVal)

{
  double *pdVar1;
  shared_ptr<soplex::Tolerances> *psVar2;
  double dVar3;
  ulong extraout_XMM0_Qb;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_48;
  double local_38;
  ulong uStack_30;
  
  *minVal = 0.0;
  *maxVal = 0.0;
  psVar2 = &(this->super_SPxSimplifier<double>)._tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&psVar2->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  local_38 = Tolerances::epsilon(local_48._M_ptr);
  local_38 = -local_38;
  uStack_30 = extraout_XMM0_Qb ^ 0x8000000000000000;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  if (local_38 <= val) {
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_48,&psVar2->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              );
    local_38 = Tolerances::epsilon(local_48._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    if (val <= local_38) {
      return;
    }
    pdVar1 = (double *)infinity();
    if (*pdVar1 <= maxRes) {
      pdVar1 = (double *)infinity();
      dVar3 = -*pdVar1;
    }
    else {
      dVar3 = (side - maxRes) / val;
    }
    *minVal = dVar3;
    pdVar1 = (double *)infinity();
    maxRes = minRes;
    if (-*pdVar1 < minRes) goto LAB_001c34f4;
  }
  else {
    pdVar1 = (double *)infinity();
    if (minRes <= -*pdVar1) {
      pdVar1 = (double *)infinity();
      dVar3 = -*pdVar1;
    }
    else {
      dVar3 = (side - minRes) / val;
    }
    *minVal = dVar3;
    pdVar1 = (double *)infinity();
    if (maxRes < *pdVar1) {
LAB_001c34f4:
      dVar3 = (side - maxRes) / val;
      goto LAB_001c3541;
    }
  }
  pdVar1 = (double *)infinity();
  dVar3 = *pdVar1;
LAB_001c3541:
  *maxVal = dVar3;
  return;
}

Assistant:

void SPxMainSM<R>::computeMinMaxValues(SPxLPBase<R>& lp, R side, R val, R minRes, R maxRes,
                                       R& minVal, R& maxVal)
{
   minVal = 0;
   maxVal = 0;

   if(LT(val, R(0.0), this->tolerances()->epsilon()))
   {
      if(minRes <= R(-infinity))
         minVal = R(-infinity);
      else
         minVal = (side - minRes) / val;

      if(maxRes >= R(infinity))
         maxVal = R(infinity);
      else
         maxVal = (side - maxRes) / val;
   }
   else if(GT(val, R(0.0), this->tolerances()->epsilon()))
   {
      if(maxRes >= R(infinity))
         minVal = R(-infinity);
      else
         minVal = (side - maxRes) / val;

      if(minRes <= R(-infinity))
         maxVal = R(infinity);
      else
         maxVal = (side - minRes) / val;
   }
}